

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool __thiscall kj::String::operator!=(String *this,StringPtr *other)

{
  bool bVar1;
  StringPtr local_10;
  
  local_10.content.size_ = (this->content).size_;
  if (local_10.content.size_ == 0) {
    local_10.content.ptr = "";
  }
  else {
    local_10.content.ptr = (this->content).ptr;
  }
  local_10.content.size_ = local_10.content.size_ + (local_10.content.size_ == 0);
  bVar1 = StringPtr::operator!=(&local_10,other);
  return bVar1;
}

Assistant:

inline bool operator==(decltype(nullptr)) const { return size_ == 0; }